

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_compress.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uchar *puVar5;
  ulong uVar6;
  iterator start;
  iterator end;
  bool bVar7;
  string local_160;
  undefined4 local_13c;
  undefined1 local_138 [8];
  WOFF2Params params;
  uint8_t *output_data;
  string local_100 [8];
  string output;
  size_t output_size;
  uint8_t *input_data;
  undefined1 local_b0 [8];
  string input;
  undefined1 local_70 [8];
  string outfilename;
  allocator local_39;
  string local_38 [8];
  string filename;
  char **argv_local;
  int argc_local;
  
  filename.field_2._8_8_ = argv;
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::__cxx11::string::find_last_of((char *)local_38,0x105039);
    std::__cxx11::string::substr((ulong)((long)&input.field_2 + 8),(ulong)local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input.field_2 + 8),".woff2");
    std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
    __stream = _stdout;
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    fprintf(__stream,"Processing %s => %s\n",uVar3,uVar4);
    std::__cxx11::string::string((string *)&input_data,local_38);
    woff2::GetFileContent((string *)local_b0,(string *)&input_data);
    std::__cxx11::string::~string((string *)&input_data);
    puVar5 = (uchar *)std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::size();
    uVar6 = woff2::MaxWOFF2CompressedSize(puVar5,uVar6);
    output.field_2._8_8_ = uVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,uVar6,'\0',(allocator *)((long)&output_data + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&output_data + 7));
    params._32_8_ = std::__cxx11::string::operator[]((ulong)local_100);
    woff2::WOFF2Params::WOFF2Params((WOFF2Params *)local_138);
    uVar6 = std::__cxx11::string::size();
    bVar2 = woff2::ConvertTTFToWOFF2
                      (puVar5,uVar6,(uchar *)params._32_8_,
                       (ulong *)(output.field_2._M_local_buf + 8),(WOFF2Params *)local_138);
    bVar7 = (bVar2 & 1) != 0;
    if (bVar7) {
      std::__cxx11::string::resize((ulong)local_100);
      std::__cxx11::string::string((string *)&local_160,(string *)local_70);
      start._M_current = (char *)std::__cxx11::string::begin();
      end._M_current = (char *)std::__cxx11::string::end();
      woff2::SetFileContents(&local_160,start,end);
      std::__cxx11::string::~string((string *)&local_160);
    }
    else {
      fprintf(_stderr,"Compression failed.\n");
    }
    argv_local._4_4_ = (uint)!bVar7;
    local_13c = 1;
    woff2::WOFF2Params::~WOFF2Params((WOFF2Params *)local_138);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    fprintf(_stderr,"One argument, the input filename, must be provided.\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  using std::string;

  if (argc != 2) {
    fprintf(stderr, "One argument, the input filename, must be provided.\n");
    return 1;
  }

  string filename(argv[1]);
  string outfilename = filename.substr(0, filename.find_last_of(".")) + ".woff2";
  fprintf(stdout, "Processing %s => %s\n",
    filename.c_str(), outfilename.c_str());
  string input = woff2::GetFileContent(filename);

  const uint8_t* input_data = reinterpret_cast<const uint8_t*>(input.data());
  size_t output_size = woff2::MaxWOFF2CompressedSize(input_data, input.size());
  string output(output_size, 0);
  uint8_t* output_data = reinterpret_cast<uint8_t*>(&output[0]);

  woff2::WOFF2Params params;
  if (!woff2::ConvertTTFToWOFF2(input_data, input.size(),
                                output_data, &output_size, params)) {
    fprintf(stderr, "Compression failed.\n");
    return 1;
  }
  output.resize(output_size);

  woff2::SetFileContents(outfilename, output.begin(), output.end());

  return 0;
}